

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool VW::is_ring_example(vw *all,example *ae)

{
  pointer ppVar1;
  bool bVar2;
  pointer ppVar3;
  
  ppVar3 = (all->p->example_pool).m_chunk_bounds.
           super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (all->p->example_pool).m_chunk_bounds.
           super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 == ppVar1) {
    return false;
  }
  do {
    bVar2 = ae <= ppVar3->second && ppVar3->first <= ae;
    if (bVar2) {
      return bVar2;
    }
    ppVar3 = ppVar3 + 1;
  } while (ppVar3 != ppVar1);
  return bVar2;
}

Assistant:

bool is_ring_example(vw& all, example* ae) { return all.p->example_pool.is_from_pool(ae); }